

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

uint GetArgumentOffset(FunctionData *data,uint argument)

{
  uint uVar1;
  ArgumentData *pAVar3;
  uint i;
  uint index;
  int iVar2;
  
  uVar1 = 0;
  for (index = 0; argument != index; index = index + 1) {
    pAVar3 = SmallArray<ArgumentData,_4U>::operator[](&data->arguments,index);
    iVar2 = (int)pAVar3->type->size;
    if (iVar2 - 1U < 3) {
      iVar2 = 4;
    }
    uVar1 = iVar2 + uVar1;
  }
  return uVar1;
}

Assistant:

unsigned GetArgumentOffset(FunctionData *data, unsigned argument)
{
	// Start at context
	unsigned offset = 0;

	for(unsigned i = 0; i < argument; i++)
	{
		unsigned size = unsigned(data->arguments[i].type->size);

		if(size != 0 && size < 4)
			size = 4;

		offset += size;
	}

	return offset;
}